

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O1

void al_transform_coordinates_4d(ALLEGRO_TRANSFORM *trans,float *x,float *y,float *z,float *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar1 = *x;
  fVar2 = *y;
  fVar3 = *z;
  fVar4 = *w;
  fVar5 = trans->m[1][1];
  fVar6 = trans->m[0][1];
  fVar7 = trans->m[2][1];
  fVar8 = trans->m[3][1];
  fVar9 = trans->m[1][2];
  fVar10 = trans->m[0][2];
  fVar11 = trans->m[2][2];
  fVar12 = trans->m[3][2];
  fVar13 = trans->m[1][3];
  fVar14 = trans->m[0][3];
  fVar15 = trans->m[2][3];
  fVar16 = trans->m[3][3];
  *x = trans->m[3][0] * fVar4 +
       trans->m[2][0] * fVar3 + trans->m[0][0] * fVar1 + trans->m[1][0] * fVar2;
  *y = fVar8 * fVar4 + fVar7 * fVar3 + fVar6 * fVar1 + fVar5 * fVar2;
  *z = fVar12 * fVar4 + fVar11 * fVar3 + fVar10 * fVar1 + fVar9 * fVar2;
  *w = fVar4 * fVar16 + fVar3 * fVar15 + fVar1 * fVar14 + fVar2 * fVar13;
  return;
}

Assistant:

void al_transform_coordinates_4d(const ALLEGRO_TRANSFORM *trans,
   float *x, float *y, float *z, float *w)
{
   float rx, ry, rz, rw;
   ASSERT(trans);
   ASSERT(x);
   ASSERT(y);
   ASSERT(z);
   ASSERT(w);

   #define M(i, j) trans->m[i][j]

   rx = M(0, 0) * *x + M(1, 0) * *y + M(2, 0) * *z + M(3, 0) * *w;
   ry = M(0, 1) * *x + M(1, 1) * *y + M(2, 1) * *z + M(3, 1) * *w;
   rz = M(0, 2) * *x + M(1, 2) * *y + M(2, 2) * *z + M(3, 2) * *w;
   rw = M(0, 3) * *x + M(1, 3) * *y + M(2, 3) * *z + M(3, 3) * *w;

   #undef M

   *x = rx;
   *y = ry;
   *z = rz;
   *w = rw;
}